

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_extract.cpp
# Opt level: O2

ScalarFunction * duckdb::MapExtractValueFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_a9;
  code *local_a8 [2];
  code *local_98;
  code *local_90;
  LogicalType local_88 [24];
  LogicalType local_70 [24];
  LogicalType local_58 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  LogicalType local_28 [24];
  
  duckdb::LogicalType::LogicalType(local_70,ANY);
  duckdb::LogicalType::LogicalType(local_58,ANY);
  __l._M_len = 2;
  __l._M_array = local_70;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_a9);
  duckdb::LogicalType::LogicalType(local_88,ANY);
  local_a8[1] = (code *)0x0;
  local_a8[0] = MapExtractValueFunc;
  local_90 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_28,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_a8);
  duckdb::LogicalType::~LogicalType(local_88);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_70 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::LogicalType(local_70,ANY);
  LogicalType::operator=((LogicalType *)&in_RDI->field_0x78,local_70);
  duckdb::LogicalType::~LogicalType(local_70);
  in_RDI->field_0xa9 = 1;
  return in_RDI;
}

Assistant:

ScalarFunction MapExtractValueFun::GetFunction() {
	ScalarFunction fun({LogicalType::ANY, LogicalType::ANY}, LogicalType::ANY, MapExtractValueFunc,
	                   MapExtractBind<true>);
	fun.varargs = LogicalType::ANY;
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}